

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall
BufferedFile::BufferedFile(BufferedFile *this,AutoFile *file,uint64_t nBufSize,uint64_t nRewindIn)

{
  char *pcVar1;
  long in_FS_OFFSET;
  uint local_38 [2];
  undefined8 local_30;
  allocator_type local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_src = file;
  this->nSrcPos = 0;
  this->m_read_pos = 0;
  this->nReadLimit = 0xffffffffffffffff;
  this->nRewind = nRewindIn;
  local_38[0] = local_38[0] & 0xffffff00;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&this->vchBuf,nBufSize,(value_type *)local_38,&local_21);
  if (nRewindIn < nBufSize) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_30 = std::iostream_category();
    local_38[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"Rewind limit must be less than buffer size");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

BufferedFile(AutoFile& file, uint64_t nBufSize, uint64_t nRewindIn)
        : m_src{file}, nReadLimit{std::numeric_limits<uint64_t>::max()}, nRewind{nRewindIn}, vchBuf(nBufSize, std::byte{0})
    {
        if (nRewindIn >= nBufSize)
            throw std::ios_base::failure("Rewind limit must be less than buffer size");
    }